

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_bzip2.c
# Opt level: O0

wchar_t archive_compressor_bzip2_open(archive_write_filter *f)

{
  wchar_t wVar1;
  long in_RDI;
  wchar_t r;
  archive_string as;
  private_data_conflict2 *data;
  undefined7 in_stack_ffffffffffffffc8;
  char in_stack_ffffffffffffffcf;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  archive_write_filter *f_00;
  archive_string *as_00;
  
  as_00 = *(archive_string **)(in_RDI + 0x40);
  f_00 = (archive_write_filter *)0x0;
  archive_strncat(as_00,(void *)0x0,0);
  if (0 < *(int *)&as_00->s) {
    archive_strcat((archive_string *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (void *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
    archive_strappend_char
              ((archive_string *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcf);
  }
  *(code **)(in_RDI + 0x28) = archive_compressor_bzip2_write;
  wVar1 = __archive_write_program_open
                    (f_00,(archive_write_program_data *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (char *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  archive_string_free((archive_string *)0x169f79);
  return wVar1;
}

Assistant:

static int
archive_compressor_bzip2_open(struct archive_write_filter *f)
{
	struct private_data *data = (struct private_data *)f->data;
	struct archive_string as;
	int r;

	archive_string_init(&as);
	archive_strcpy(&as, "bzip2");

	/* Specify compression level. */
	if (data->compression_level > 0) {
		archive_strcat(&as, " -");
		archive_strappend_char(&as, '0' + data->compression_level);
	}
	f->write = archive_compressor_bzip2_write;

	r = __archive_write_program_open(f, data->pdata, as.s);
	archive_string_free(&as);
	return (r);
}